

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O3

void __thiscall
leveldb::anon_unknown_1::SingletonEnv<leveldb::(anonymous_namespace)::PosixEnv>::SingletonEnv
          (SingletonEnv<leveldb::(anonymous_namespace)::PosixEnv> *this)

{
  int iVar1;
  void *pvVar2;
  _Map_pointer __n;
  long *plVar3;
  long *plVar4;
  bool bVar5;
  rlimit rlim;
  rlimit local_20;
  
  _ZN7leveldb12_GLOBAL__N_112SingletonEnvINS0_8PosixEnvEE16env_initialized_E_0 = 1;
  Env::Default::env_container.env_storage_.__align =
       (anon_struct_8_0_00000001_for___align)&PTR__PosixEnv_0015ca58;
  Env::Default::env_container.env_storage_._8_8_ = 0;
  Env::Default::env_container.env_storage_._16_8_ = 0;
  Env::Default::env_container.env_storage_._24_8_ = 0;
  Env::Default::env_container.env_storage_._32_8_ = 0;
  Env::Default::env_container.env_storage_._40_8_ = 0;
  std::condition_variable::condition_variable
            ((condition_variable *)(Env::Default::env_container.env_storage_.__data + 0x30));
  Env::Default::env_container.env_storage_._96_8_ = 0x15d4b0;
  Env::Default::env_container.env_storage_.__data[0x68] = '\0';
  Env::Default::env_container.env_storage_._112_8_ = 0;
  Env::Default::env_container.env_storage_._128_8_ = 0;
  Env::Default::env_container.env_storage_._136_8_ = 0;
  Env::Default::env_container.env_storage_._144_8_ = 0;
  Env::Default::env_container.env_storage_._152_8_ = 0;
  Env::Default::env_container.env_storage_._160_8_ = 0;
  Env::Default::env_container.env_storage_._168_8_ = 0;
  Env::Default::env_container.env_storage_._176_8_ = 0;
  Env::Default::env_container.env_storage_._184_8_ = 0;
  Env::Default::env_container.env_storage_._120_8_ = 8;
  Env::Default::env_container.env_storage_._112_8_ = operator_new(0x40);
  plVar3 = (long *)((Env::Default::env_container.env_storage_._120_8_ * 4 - 4U & 0xfffffffffffffff8)
                   + Env::Default::env_container.env_storage_._112_8_);
  plVar4 = plVar3;
  do {
    pvVar2 = operator_new(0x200);
    *plVar4 = (long)pvVar2;
    bVar5 = plVar4 < plVar3;
    plVar4 = plVar4 + 1;
  } while (bVar5);
  Env::Default::env_container.env_storage_._128_8_ = *plVar3;
  Env::Default::env_container.env_storage_._144_8_ =
       Env::Default::env_container.env_storage_._128_8_ + 0x200;
  Env::Default::env_container.env_storage_._192_8_ = 0;
  Env::Default::env_container.env_storage_._200_8_ = 0;
  Env::Default::env_container.env_storage_._208_8_ = 0;
  Env::Default::env_container.env_storage_._216_8_ = 0;
  Env::Default::env_container.env_storage_._224_8_ = 0;
  Env::Default::env_container.env_storage_._240_4_ = 0;
  Env::Default::env_container.env_storage_._248_8_ = 0;
  Env::Default::env_container.env_storage_._256_8_ = 0x15d598;
  Env::Default::env_container.env_storage_._264_8_ = 0x15d598;
  Env::Default::env_container.env_storage_._272_8_ = 0;
  Env::Default::env_container.env_storage_._280_4_ = (anonymous_namespace)::g_mmap_limit;
  Env::Default::env_container.env_storage_._136_8_ =
       Env::Default::env_container.env_storage_._128_8_;
  Env::Default::env_container.env_storage_._152_8_ = plVar3;
  Env::Default::env_container.env_storage_._160_8_ =
       Env::Default::env_container.env_storage_._128_8_;
  Env::Default::env_container.env_storage_._168_8_ =
       Env::Default::env_container.env_storage_._128_8_;
  Env::Default::env_container.env_storage_._176_8_ =
       Env::Default::env_container.env_storage_._144_8_;
  Env::Default::env_container.env_storage_._184_8_ = plVar3;
  if ((anonymous_namespace)::g_open_read_only_file_limit < 0) {
    iVar1 = getrlimit(RLIMIT_NOFILE,&local_20);
    (anonymous_namespace)::g_open_read_only_file_limit = 0x32;
    if (iVar1 == 0) {
      if (local_20.rlim_cur == 0xffffffffffffffff) {
        (anonymous_namespace)::g_open_read_only_file_limit = 0x7fffffff;
      }
      else {
        (anonymous_namespace)::g_open_read_only_file_limit = (int)(local_20.rlim_cur / 5);
      }
    }
  }
  Env::Default::env_container.env_storage_._284_4_ =
       (anonymous_namespace)::g_open_read_only_file_limit;
  return;
}

Assistant:

const std::string& filename() const { return filename_; }